

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

char * get_mods_name(int mods)

{
  char *pcStack_10;
  int mods_local;
  
  if (mods == 0) {
    pcStack_10 = " no mods";
  }
  else {
    get_mods_name::name[0] = '\0';
    if ((mods & 1U) != 0) {
      strcat(get_mods_name::name," shift");
    }
    if ((mods & 2U) != 0) {
      strcat(get_mods_name::name," control");
    }
    if ((mods & 4U) != 0) {
      strcat(get_mods_name::name," alt");
    }
    if ((mods & 8U) != 0) {
      strcat(get_mods_name::name," super");
    }
    pcStack_10 = get_mods_name::name;
  }
  return pcStack_10;
}

Assistant:

static const char* get_mods_name(int mods)
{
    static char name[512];

    if (mods == 0)
        return " no mods";

    name[0] = '\0';

    if (mods & GLFW_MOD_SHIFT)
        strcat(name, " shift");
    if (mods & GLFW_MOD_CONTROL)
        strcat(name, " control");
    if (mods & GLFW_MOD_ALT)
        strcat(name, " alt");
    if (mods & GLFW_MOD_SUPER)
        strcat(name, " super");

    return name;
}